

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

void __thiscall
sentencepiece::NormalizerSpec::InternalSwap(NormalizerSpec *this,NormalizerSpec *other)

{
  InternalMetadata *this_00;
  bool bVar1;
  uint32 uVar2;
  void *pvVar3;
  void *pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  
  google::protobuf::internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  pvVar3 = (other->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar4 & 1) == 0) {
    if (((ulong)pvVar3 & 1) == 0) goto LAB_001e73c3;
  }
  else if (((ulong)pvVar3 & 1) == 0) {
    google::protobuf::internal::InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
              (&(other->super_MessageLite)._internal_metadata_);
    pvVar4 = this_00->ptr_;
  }
  if (((ulong)pvVar4 & 1) == 0) {
    pbVar5 = google::protobuf::internal::InternalMetadata::
             mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
  }
  else {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
  }
  std::__cxx11::string::swap((string *)pbVar5);
LAB_001e73c3:
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pvVar3 = (this->name_).tagged_ptr_.ptr_;
  (this->name_).tagged_ptr_.ptr_ = (other->name_).tagged_ptr_.ptr_;
  (other->name_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (this->precompiled_charsmap_).tagged_ptr_.ptr_;
  (this->precompiled_charsmap_).tagged_ptr_.ptr_ = (other->precompiled_charsmap_).tagged_ptr_.ptr_;
  (other->precompiled_charsmap_).tagged_ptr_.ptr_ = pvVar3;
  pvVar3 = (this->normalization_rule_tsv_).tagged_ptr_.ptr_;
  (this->normalization_rule_tsv_).tagged_ptr_.ptr_ =
       (other->normalization_rule_tsv_).tagged_ptr_.ptr_;
  (other->normalization_rule_tsv_).tagged_ptr_.ptr_ = pvVar3;
  bVar1 = this->add_dummy_prefix_;
  this->add_dummy_prefix_ = other->add_dummy_prefix_;
  other->add_dummy_prefix_ = bVar1;
  bVar1 = this->remove_extra_whitespaces_;
  this->remove_extra_whitespaces_ = other->remove_extra_whitespaces_;
  other->remove_extra_whitespaces_ = bVar1;
  bVar1 = this->escape_whitespaces_;
  this->escape_whitespaces_ = other->escape_whitespaces_;
  other->escape_whitespaces_ = bVar1;
  return;
}

Assistant:

void NormalizerSpec::InternalSwap(NormalizerSpec* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  precompiled_charsmap_.Swap(&other->precompiled_charsmap_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  normalization_rule_tsv_.Swap(&other->normalization_rule_tsv_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(add_dummy_prefix_, other->add_dummy_prefix_);
  swap(remove_extra_whitespaces_, other->remove_extra_whitespaces_);
  swap(escape_whitespaces_, other->escape_whitespaces_);
}